

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfrs.cpp
# Opt level: O3

uint64_t icu_63::util64_pow(uint32_t base,uint16_t exponent)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ushort uVar5;
  
  if (base != 0) {
    uVar2 = (ulong)base;
    uVar1 = uVar2;
    if ((exponent & 1) == 0) {
      uVar1 = 1;
    }
    uVar3 = (ulong)exponent;
    if (1 < exponent) {
      do {
        uVar2 = uVar2 * uVar2;
        uVar4 = uVar2;
        if ((uVar3 & 2) == 0) {
          uVar4 = 1;
        }
        uVar1 = uVar1 * uVar4;
        uVar5 = (ushort)uVar3;
        uVar3 = uVar3 >> 1;
      } while (3 < uVar5);
    }
    return uVar1;
  }
  return 0;
}

Assistant:

uint64_t util64_pow(uint32_t base, uint16_t exponent)  {
    if (base == 0) {
        return 0;
    }
    uint64_t result = 1;
    uint64_t pow = base;
    while (true) {
        if ((exponent & 1) == 1) {
            result *= pow;
        }
        exponent >>= 1;
        if (exponent == 0) {
            break;
        }
        pow *= pow;
    }
    return result;
}